

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::MergeReturnPass::BranchToBlock
          (MergeReturnPass *this,BasicBlock *block,uint32_t target)

{
  uint32_t pred_blk_id;
  BasicBlock *this_00;
  Instruction *pIVar1;
  CFG *pCVar2;
  DefUseManager *this_01;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_02;
  initializer_list<unsigned_int> init_list;
  BasicBlock *target_block;
  uint32_t local_a4;
  uint local_a0;
  undefined4 uStack_9c;
  SmallVector<unsigned_int,_2UL> local_98;
  undefined1 local_70 [40];
  Instruction *local_48;
  pointer pOStack_40;
  IRContext *local_38;
  
  BasicBlock::tail((BasicBlock *)&local_a0);
  if (*(int *)(CONCAT44(uStack_9c,local_a0) + 0x28) != 0xfd) {
    BasicBlock::tail((BasicBlock *)local_70);
    if (*(int *)&(((InstructionList *)(local_70._0_8_ + 0x20))->
                 super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase != 0xfe
       ) goto LAB_00521386;
  }
  RecordReturned(this,block);
  RecordReturnValue(this,block);
LAB_00521386:
  this_00 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,target);
  target_block = this_00;
  pIVar1 = BasicBlock::GetLoopMergeInst(this_00);
  if (pIVar1 != (Instruction *)0x0) {
    pCVar2 = Pass::cfg((Pass *)this);
    CFG::SplitLoopHeader(pCVar2,this_00);
  }
  UpdatePhiNodes(this,block,this_00);
  pIVar1 = BasicBlock::terminator(block);
  pIVar1->opcode_ = OpBranch;
  init_list._M_len = 1;
  init_list._M_array = &local_a4;
  local_a4 = target;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)local_70,init_list);
  local_a0 = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            (&local_98,(SmallVector<unsigned_int,_2UL> *)local_70);
  local_48 = (Instruction *)0x0;
  pOStack_40 = (pointer)0x0;
  local_38 = (IRContext *)0x0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             &local_a0,local_70);
  Instruction::ReplaceOperands(pIVar1,(OperandList *)&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)local_70);
  this_01 = IRContext::get_def_use_mgr((this->super_MemPass).super_Pass.context_);
  analysis::DefUseManager::AnalyzeInstDefUse(this_01,pIVar1);
  this_02 = &std::__detail::
             _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->new_edges_,&target_block)->_M_t;
  local_a0 = BasicBlock::id(block);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_insert_unique<unsigned_int>(this_02,&local_a0);
  pCVar2 = Pass::cfg((Pass *)this);
  pred_blk_id = BasicBlock::id(block);
  CFG::AddEdge(pCVar2,pred_blk_id,target);
  return;
}

Assistant:

void MergeReturnPass::BranchToBlock(BasicBlock* block, uint32_t target) {
  if (block->tail()->opcode() == spv::Op::OpReturn ||
      block->tail()->opcode() == spv::Op::OpReturnValue) {
    RecordReturned(block);
    RecordReturnValue(block);
  }

  BasicBlock* target_block = context()->get_instr_block(target);
  if (target_block->GetLoopMergeInst()) {
    cfg()->SplitLoopHeader(target_block);
  }
  UpdatePhiNodes(block, target_block);

  Instruction* return_inst = block->terminator();
  return_inst->SetOpcode(spv::Op::OpBranch);
  return_inst->ReplaceOperands({{SPV_OPERAND_TYPE_ID, {target}}});
  context()->get_def_use_mgr()->AnalyzeInstDefUse(return_inst);
  new_edges_[target_block].insert(block->id());
  cfg()->AddEdge(block->id(), target);
}